

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool setFontSizeFromValue(Value *value,QFont *font,int *fontSizeAdjustment)

{
  bool bVar1;
  char cVar2;
  undefined4 uVar3;
  int iVar4;
  int pixelSize;
  QVariant *this;
  long in_FS_OFFSET;
  double dVar5;
  QLatin1String QVar6;
  QLatin1String QVar7;
  QArrayData *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (value->type == Length) {
    this = &value->variant;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QVariant::toString();
    QVar6.m_data = (char *)0x2;
    QVar6.m_size = (qsizetype)&local_68;
    cVar2 = QString::endsWith(QVar6,0x6bf060);
    if (cVar2 == '\0') {
      QVar7.m_data = (char *)0x2;
      QVar7.m_size = (qsizetype)&local_68;
      cVar2 = QString::endsWith(QVar7,0x6a6120);
      if (cVar2 != '\0') {
        QString::chop((longlong)&local_68);
        QVariant::QVariant(&local_48,(QString *)&local_68);
        QVariant::operator=(this,&local_48);
        QVariant::~QVariant(&local_48);
        cVar2 = QVariant::convert((QMetaType)this);
        if (cVar2 != '\0') {
          iVar4 = QVariant::toInt((bool *)this);
          pixelSize = 0xffffff;
          if (iVar4 < 0xffffff) {
            pixelSize = iVar4;
          }
          if (pixelSize < 1) {
            pixelSize = 0;
          }
          QFont::setPixelSize(font,pixelSize);
        }
      }
    }
    else {
      QString::chop((longlong)&local_68);
      QVariant::QVariant(&local_48,(QString *)&local_68);
      QVariant::operator=(this,&local_48);
      QVariant::~QVariant(&local_48);
      cVar2 = QVariant::convert((QMetaType)this);
      if (cVar2 != '\0') {
        dVar5 = (double)QVariant::toReal((bool *)this);
        bVar1 = 16777215.0 < dVar5;
        if (dVar5 <= 0.0) {
          dVar5 = 0.0;
        }
        QFont::setPointSizeF
                  (font,(qreal)(-(ulong)bVar1 & 0x416fffffe0000000 | ~-(ulong)bVar1 & (ulong)dVar5))
        ;
      }
    }
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,2,0x10);
      }
    }
  }
  else if (value->type == KnownIdentifier) {
    uVar3 = QVariant::toInt((bool *)&value->variant);
    switch(uVar3) {
    case 6:
      *fontSizeAdjustment = -1;
      break;
    case 7:
      *fontSizeAdjustment = 0;
      break;
    case 8:
      *fontSizeAdjustment = 1;
      break;
    case 9:
      *fontSizeAdjustment = 2;
      break;
    case 10:
      *fontSizeAdjustment = 3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return SUB81(*(long *)(in_FS_OFFSET + 0x28),0);
}

Assistant:

static bool setFontSizeFromValue(QCss::Value value, QFont *font, int *fontSizeAdjustment)
{
    if (value.type == Value::KnownIdentifier) {
        bool valid = true;
        switch (value.variant.toInt()) {
            case Value_Small: *fontSizeAdjustment = -1; break;
            case Value_Medium: *fontSizeAdjustment = 0; break;
            case Value_Large: *fontSizeAdjustment = 1; break;
            case Value_XLarge: *fontSizeAdjustment = 2; break;
            case Value_XXLarge: *fontSizeAdjustment = 3; break;
            default: valid = false; break;
        }
        return valid;
    }
    if (value.type != Value::Length)
        return false;

    bool valid = false;
    QString s = value.variant.toString();
    if (s.endsWith("pt"_L1, Qt::CaseInsensitive)) {
        s.chop(2);
        value.variant = s;
        if (value.variant.convert(QMetaType::fromType<qreal>())) {
            font->setPointSizeF(qBound(qreal(0), value.variant.toReal(), qreal(1 << 24) - 1));
            valid = true;
        }
    } else if (s.endsWith("px"_L1, Qt::CaseInsensitive)) {
        s.chop(2);
        value.variant = s;
        if (value.variant.convert(QMetaType::fromType<qreal>())) {
            font->setPixelSize(qBound(0, value.variant.toInt(), (1 << 24) - 1));
            valid = true;
        }
    }
    return valid;
}